

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void __thiscall DPSprite::SetState(DPSprite *this,FState *newstate,bool pending)

{
  WORD *pWVar1;
  ushort uVar2;
  APlayerPawn *self;
  uint uVar3;
  AActor *stateowner;
  int iVar4;
  bool bVar5;
  FStateParamInfo stp;
  FState *nextstate;
  FStateParamInfo local_48;
  FState *local_38;
  
  if (this->ID == 1) {
    pWVar1 = &this->Owner->WeaponState;
    *pWVar1 = *pWVar1 & 0xf090;
  }
  this->processPending = pending;
  do {
    if (newstate == (FState *)0x0) {
      (*(this->super_DObject)._vptr_DObject[4])(this);
      return;
    }
    this->State = newstate;
    uVar2 = newstate->sprite;
    if (uVar2 != 1) {
      if ((newstate->field_0x22 & 2) == 0) {
        this->Frame = (uint)newstate->Frame;
      }
      if (uVar2 != 2) {
        this->Sprite = (uint)uVar2;
      }
    }
    iVar4 = (int)newstate->Tics;
    if (newstate->TicRange != 0) {
      uVar3 = FRandom::GenRand32(&FState::pr_statetics);
      iVar4 = iVar4 + uVar3 % (newstate->TicRange + 1);
    }
    this->Tics = iVar4;
    if ((this->Flags & 8) != 0) {
      if ((sv_fastweapons.Value == 2) && (this->ID == 1)) {
        bVar5 = newstate->ActionFunc == (VMFunction *)0x0;
LAB_0052c458:
        bVar5 = !bVar5;
      }
      else {
        if (sv_fastweapons.Value == 0) goto LAB_0052c461;
        bVar5 = true;
        if (sv_fastweapons.Value == 3) {
          iVar4 = (int)newstate->Tics;
          if (newstate->TicRange != 0) {
            uVar3 = FRandom::GenRand32(&FState::pr_statetics);
            iVar4 = iVar4 + uVar3 % (newstate->TicRange + 1);
          }
          bVar5 = iVar4 == 0;
          goto LAB_0052c458;
        }
      }
      this->Tics = (uint)bVar5;
    }
LAB_0052c461:
    iVar4 = this->ID;
    if (iVar4 != 1000) {
      if (newstate->Misc1 != 0) {
        this->x = (double)newstate->Misc1;
      }
      if (newstate->Misc2 != 0) {
        this->y = (double)newstate->Misc2;
      }
    }
    if (this->Owner->mo == (APlayerPawn *)0x0) {
LAB_0052c52a:
      newstate = this->State->NextState;
    }
    else {
      local_48.mStateType = STATE_Psprite;
      self = this->Owner->mo;
      stateowner = (this->Caller).field_0.p;
      if ((stateowner != (AActor *)0x0) &&
         (((stateowner->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->Caller).field_0.p = (AActor *)0x0;
        stateowner = (AActor *)0x0;
      }
      local_48.mCallingState = newstate;
      local_48.mPSPIndex = iVar4;
      bVar5 = FState::CallAction(newstate,&self->super_AActor,stateowner,&local_48,&local_38);
      if (bVar5) {
        iVar4 = 1;
        if (((this->super_DObject).ObjectFlags & 0x20) == 0) {
          if (local_38 == (FState *)0x0) {
            if (this->State != (FState *)0x0) goto LAB_0052c50c;
            (*(this->super_DObject)._vptr_DObject[4])(this);
          }
          else {
            this->Tics = 0;
            iVar4 = 3;
            newstate = local_38;
          }
        }
      }
      else {
LAB_0052c50c:
        iVar4 = 0;
      }
      if (iVar4 == 0) goto LAB_0052c52a;
      if (iVar4 != 3) {
        return;
      }
    }
    if (this->Tics != 0) {
      return;
    }
  } while( true );
}

Assistant:

void DPSprite::SetState(FState *newstate, bool pending)
{
	if (ID == PSP_WEAPON)
	{ // A_WeaponReady will re-set these as needed
		Owner->WeaponState &= ~(WF_WEAPONREADY | WF_WEAPONREADYALT | WF_WEAPONBOBBING | WF_WEAPONSWITCHOK | WF_WEAPONRELOADOK | WF_WEAPONZOOMOK |
								WF_USER1OK | WF_USER2OK | WF_USER3OK | WF_USER4OK);
	}

	processPending = pending;

	do
	{
		if (newstate == nullptr)
		{ // Object removed itself.
			Destroy();
			return;
		}
		State = newstate;

		if (newstate->sprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				Frame = newstate->GetFrame();
			}
			if (newstate->sprite != SPR_NOCHANGE)
			{ // okay to change sprite
				Sprite = newstate->sprite;
			}
		}

		Tics = newstate->GetTics(); // could be 0

		if (Flags & PSPF_CVARFAST)
		{
			if (sv_fastweapons == 2 && ID == PSP_WEAPON)
				Tics = newstate->ActionFunc == nullptr ? 0 : 1;
			else if (sv_fastweapons == 3)
				Tics = (newstate->GetTics() != 0);
			else if (sv_fastweapons)
				Tics = 1;		// great for producing decals :)
		}

		if (ID != PSP_FLASH)
		{ // It's still possible to set the flash layer's offsets with the action function.
			if (newstate->GetMisc1())
			{ // Set coordinates.
				x = newstate->GetMisc1();
			}
			if (newstate->GetMisc2())
			{
				y = newstate->GetMisc2();
			}
		}

		if (Owner->mo != nullptr)
		{
			FState *nextstate;
			FStateParamInfo stp = { newstate, STATE_Psprite, ID };
			if (newstate->CallAction(Owner->mo, Caller, &stp, &nextstate))
			{
				// It's possible this call resulted in this very layer being replaced.
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return;
				}
				if (nextstate != nullptr)
				{
					newstate = nextstate;
					Tics = 0;
					continue;
				}
				if (State == nullptr)
				{
					Destroy();
					return;
				}
			}
		}

		newstate = State->GetNextState();
	} while (!Tics); // An initial state of 0 could cycle through.

	return;
}